

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvi.inc.c
# Opt level: O1

_Bool trans_fence_i(DisasContext_conflict12 *ctx,arg_fence_i *a)

{
  _Bool _Var1;
  TCGContext_conflict11 *tcg_ctx;
  
  _Var1 = ctx->ext_ifencei;
  if (_Var1 == true) {
    tcg_ctx = ctx->uc->tcg_ctx;
    tcg_gen_op2_riscv64(tcg_ctx,INDEX_op_movi_i64,(TCGArg)(tcg_ctx->cpu_pc + (long)tcg_ctx),
                        ctx->pc_succ_insn);
    exit_tb(ctx);
    (ctx->base).is_jmp = DISAS_NORETURN;
  }
  return _Var1;
}

Assistant:

static bool trans_fence_i(DisasContext *ctx, arg_fence_i *a)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    if (!ctx->ext_ifencei) {
        return false;
    }

    /*
     * FENCE_I is a no-op in QEMU,
     * however we need to end the translation block
     */
    tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_pc, ctx->pc_succ_insn);
    exit_tb(ctx);
    ctx->base.is_jmp = DISAS_NORETURN;
    return true;
}